

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

void __thiscall soul::Structure::addMember(Structure *this,Type *type,string *memberName)

{
  undefined1 uVar1;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  mapped_type mVar2;
  undefined4 uVar10;
  undefined8 uVar3;
  bool bVar11;
  Structure *this_00;
  mapped_type *pmVar12;
  string_view memberName_00;
  undefined1 local_70 [8];
  undefined1 local_68 [56];
  ReadWriteCount local_30;
  undefined7 uVar5;
  undefined6 uVar7;
  undefined5 uVar9;
  
  memberName_00._M_str = (memberName->_M_dataplus)._M_p;
  memberName_00._M_len = memberName->_M_string_length;
  bVar11 = hasMemberWithName(this,memberName_00);
  if (bVar11) {
    throwInternalCompilerError("! hasMemberWithName (memberName)","addMember",0x2a);
  }
  if (type->category == structure) {
    Type::getStruct((Type *)local_70);
    this_00 = RefCountedPtr<soul::Structure>::operator->((RefCountedPtr<soul::Structure> *)local_70)
    ;
    local_68[0] = structure;
    local_68[1] = invalid;
    local_68[2] = false;
    local_68[3] = false;
    local_68._4_4_ = invalid;
    local_68[8] = 0;
    local_68._9_7_ = 0;
    (this->super_RefCountedObject).refCount = (this->super_RefCountedObject).refCount + 1;
    local_68._16_8_ = this;
    bVar11 = containsMemberOfType(this_00,(Type *)local_68,true);
    if (bVar11) {
      throwInternalCompilerError
                ("! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true))"
                 ,"addMember",0x2d);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)(local_68 + 0x10));
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_70);
  }
  mVar2 = (this->members).numActive;
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->memberIndexMap,memberName);
  *pmVar12 = mVar2;
  uVar1 = type->category;
  uVar4 = type->arrayElementCategory;
  uVar6 = type->isRef;
  uVar8 = type->isConstant;
  uVar10 = type->primitiveType;
  uVar9 = CONCAT41(uVar10,uVar8);
  uVar7 = CONCAT51(uVar9,uVar6);
  uVar5 = CONCAT61(uVar7,uVar4);
  uVar3._0_4_ = type->boundingSize;
  uVar3._4_4_ = type->arrayElementBoundingSize;
  local_68[8] = (undefined1)(undefined4)uVar3;
  local_68._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  local_68._16_8_ = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  local_68[0] = uVar1;
  local_68._1_7_ = uVar5;
  std::__cxx11::string::string((string *)(local_68 + 0x18),(string *)memberName);
  local_30.numReads = 0;
  local_30.numWrites = 0;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::push_back(&this->members,(Member *)local_68)
  ;
  Member::~Member((Member *)local_68);
  return;
}

Assistant:

void Structure::addMember (Type type, std::string memberName)
{
    SOUL_ASSERT (! hasMemberWithName (memberName));

    // Ensure we won't create a recursive structure (one containing itself) if we add a member of this type
    SOUL_ASSERT (! (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (*this), true)));

    memberIndexMap[memberName] = members.size();
    members.push_back ({ std::move (type), std::move (memberName) });

}